

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::NoopNormalizer2::append
          (NoopNormalizer2 *this,UnicodeString *first,UnicodeString *second,UErrorCode *errorCode)

{
  UBool UVar1;
  UErrorCode *errorCode_local;
  UnicodeString *second_local;
  UnicodeString *first_local;
  NoopNormalizer2 *this_local;
  
  UVar1 = ::U_SUCCESS(*errorCode);
  if (UVar1 != '\0') {
    if (first == second) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      UnicodeString::append(first,second);
    }
  }
  return first;
}

Assistant:

virtual UnicodeString &
    append(UnicodeString &first,
           const UnicodeString &second,
           UErrorCode &errorCode) const U_OVERRIDE {
        if(U_SUCCESS(errorCode)) {
            if(&first!=&second) {
                first.append(second);
            } else {
                errorCode=U_ILLEGAL_ARGUMENT_ERROR;
            }
        }
        return first;
    }